

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfnt.cpp
# Opt level: O2

void __thiscall
dpfb::SfntOffsetTable::SfntOffsetTable(SfntOffsetTable *this,Stream *stream,uint32_t fontIdx)

{
  uint *puVar1;
  uint16_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  long lVar5;
  StreamError *pSVar6;
  bool bVar7;
  TableRecord tableRecord;
  
  (this->tableRecords).
  super__Vector_base<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tableRecords).
  super__Vector_base<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tableRecords).
  super__Vector_base<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*stream->_vptr_Stream[7])(stream,0,0);
  uVar3 = streams::Stream::readU32Be(stream);
  if (uVar3 == 0x74746366) {
    uVar2 = streams::Stream::readU16Be(stream);
    if ((ushort)(uVar2 - 3) < 0xfffe) {
      pSVar6 = (StreamError *)__cxa_allocate_exception(0x10);
      str::format_abi_cxx11_
                ((string *)&tableRecord,"Invalid TTC header major version %u",(ulong)uVar2);
      streams::StreamError::runtime_error(pSVar6,(string *)&tableRecord);
      __cxa_throw(pSVar6,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar2 = streams::Stream::readU16Be(stream);
    if (uVar2 != 0) {
      pSVar6 = (StreamError *)__cxa_allocate_exception(0x10);
      str::format_abi_cxx11_
                ((string *)&tableRecord,"Invalid TTC header minor version %u",(ulong)uVar2);
      streams::StreamError::runtime_error(pSVar6,(string *)&tableRecord);
      __cxa_throw(pSVar6,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar4 = streams::Stream::readU32Be(stream);
    if (uVar4 == 0) {
      pSVar6 = (StreamError *)__cxa_allocate_exception(0x10);
      streams::StreamError::runtime_error(pSVar6,"Collection has no fonts");
      __cxa_throw(pSVar6,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (uVar4 <= fontIdx) {
      pSVar6 = (StreamError *)__cxa_allocate_exception(0x10);
      str::format_abi_cxx11_
                ((string *)&tableRecord,"Collection contains only %u fonts",(ulong)uVar4);
      streams::StreamError::runtime_error(pSVar6,(string *)&tableRecord);
      __cxa_throw(pSVar6,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
    }
    (*stream->_vptr_Stream[7])(stream,(ulong)fontIdx << 2,1);
    uVar4 = streams::Stream::readU32Be(stream);
    (*stream->_vptr_Stream[7])(stream,(ulong)uVar4,0);
    uVar3 = streams::Stream::readU32Be(stream);
  }
  else if (fontIdx != 0) {
    pSVar6 = (StreamError *)__cxa_allocate_exception(0x10);
    str::format_abi_cxx11_
              ((string *)&tableRecord,
               "Can\'t load font at index %u because font is not a collection",(ulong)fontIdx);
    streams::StreamError::runtime_error(pSVar6,(string *)&tableRecord);
    __cxa_throw(pSVar6,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar5 = 0;
  do {
    if (lVar5 == 0x14) {
      pSVar6 = (StreamError *)__cxa_allocate_exception(0x10);
      str::format_abi_cxx11_((string *)&tableRecord,"Unsupported font format 0x%08x",(ulong)uVar3);
      streams::StreamError::runtime_error(pSVar6,(string *)&tableRecord);
      __cxa_throw(pSVar6,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
    }
    puVar1 = (uint *)((long)&checkOffsetTableSignature(unsigned_int)::signatures + lVar5);
    lVar5 = lVar5 + 4;
  } while (*puVar1 != uVar3);
  uVar2 = streams::Stream::readU16Be(stream);
  if (uVar2 != 0) {
    (*stream->_vptr_Stream[7])(stream,6,1);
    std::
    vector<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>
    ::reserve(&this->tableRecords,(ulong)uVar2);
    while (bVar7 = uVar2 != 0, uVar2 = uVar2 - 1, bVar7) {
      tableRecord.tag = streams::Stream::readU32Be(stream);
      (*stream->_vptr_Stream[7])(stream,4,1);
      tableRecord.offset = streams::Stream::readU32Be(stream);
      std::
      vector<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>
      ::push_back(&this->tableRecords,&tableRecord);
      (*stream->_vptr_Stream[7])(stream,4,1);
    }
    return;
  }
  pSVar6 = (StreamError *)__cxa_allocate_exception(0x10);
  streams::StreamError::runtime_error(pSVar6,"Font has no tables");
  __cxa_throw(pSVar6,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

SfntOffsetTable::SfntOffsetTable(
        Stream& stream, std::uint32_t fontIdx)
    : tableRecords {}
{
    stream.seek(0, SeekOrigin::set);

    auto version = stream.readU32Be();
    if (version == sfntTag('t', 't', 'c', 'f')) {
        const auto versionMajor = stream.readU16Be();
        if (versionMajor != 1 && versionMajor != 2)
            throw StreamError(str::format(
                "Invalid TTC header major version %" PRIu16,
                versionMajor));

        const auto versionMinor = stream.readU16Be();
        if (versionMinor != 0)
            throw StreamError(str::format(
                "Invalid TTC header minor version %" PRIu16,
                versionMinor));

        const auto numFonts = stream.readU32Be();
        if (numFonts == 0)
            throw StreamError("Collection has no fonts");

        if (fontIdx >= numFonts)
            throw StreamError(str::format(
                "Collection contains only %" PRIu32 " fonts",
                numFonts));

        stream.seek(fontIdx * sizeof(std::uint32_t), SeekOrigin::cur);
        const auto fontOffset = stream.readU32Be();
        stream.seek(fontOffset, SeekOrigin::set);

        version = stream.readU32Be();
    } else if (fontIdx > 0)
        throw StreamError(str::format(
            "Can't load font at index %" PRIu32 " because font is "
            "not a collection",
            fontIdx));

    if (!checkOffsetTableSignature(version))
        throw StreamError(str::format(
            "Unsupported font format 0x%08" PRIx32,
            version));

    const auto numTables = stream.readU16Be();
    if (numTables == 0)
        throw StreamError("Font has no tables");

    // Skip search range, entry selector, and range shift
    stream.seek(3 * sizeof(std::uint16_t), SeekOrigin::cur);

    tableRecords.reserve(numTables);
    for (std::uint16_t i = 0; i < numTables; ++i) {
        TableRecord tableRecord;
        tableRecord.tag = stream.readU32Be();

        // Skip checksum
        stream.seek(sizeof(std::uint32_t), SeekOrigin::cur);

        tableRecord.offset = stream.readU32Be();
        tableRecords.push_back(tableRecord);

        // Skip length
        stream.seek(sizeof(std::uint32_t), SeekOrigin::cur);
    }
}